

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

size_t Extract(string *where_from,string *where_to,size_t pos,char *delim)

{
  size_t sVar1;
  string asStack_48 [32];
  
  sVar1 = FindFirstOfSet(where_from,pos,delim);
  if (sVar1 == 0xffffffffffffffff) {
    std::__cxx11::string::_M_assign((string *)where_to);
  }
  else {
    std::__cxx11::string::substr((ulong)asStack_48,(ulong)where_from);
    std::__cxx11::string::operator=((string *)where_to,asStack_48);
    std::__cxx11::string::~string(asStack_48);
  }
  return sVar1;
}

Assistant:

size_t Extract(const std::string& where_from, std::string& where_to, size_t pos, const char* delim)
{
    size_t end = FindFirstOfSet(where_from, pos, delim);

    if (end != std::string::npos)
        where_to = where_from.substr(pos, end - pos);
    else
        where_to = where_from;

    return end;
}